

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

void __thiscall pbrt::BinaryWriter::startNewEntity(BinaryWriter *this)

{
  shared_ptr<pbrt::SerializedEntity> local_18;
  
  local_18.super___shared_ptr<pbrt::SerializedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  (local_18.super___shared_ptr<pbrt::SerializedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  )->_M_use_count = 1;
  (local_18.super___shared_ptr<pbrt::SerializedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  )->_M_weak_count = 1;
  (local_18.super___shared_ptr<pbrt::SerializedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  )->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0016a008;
  local_18.super___shared_ptr<pbrt::SerializedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_18.super___shared_ptr<pbrt::SerializedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_18.super___shared_ptr<pbrt::SerializedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_18.super___shared_ptr<pbrt::SerializedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._M_use_count = 0;
  local_18.super___shared_ptr<pbrt::SerializedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [1]._M_weak_count = 0;
  local_18.super___shared_ptr<pbrt::SerializedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  [2]._vptr__Sp_counted_base = (_func_int **)0x0;
  std::
  deque<std::shared_ptr<pbrt::SerializedEntity>,std::allocator<std::shared_ptr<pbrt::SerializedEntity>>>
  ::emplace_back<std::shared_ptr<pbrt::SerializedEntity>>
            ((deque<std::shared_ptr<pbrt::SerializedEntity>,std::allocator<std::shared_ptr<pbrt::SerializedEntity>>>
              *)this,&local_18);
  if (local_18.super___shared_ptr<pbrt::SerializedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<pbrt::SerializedEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void startNewEntity()
    { serializedEntity.push(std::make_shared<SerializedEntity>()); }